

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultRawMemoryAllocator.cpp
# Opt level: O3

void * __thiscall
Diligent::DefaultRawMemoryAllocator::AllocateAligned
          (DefaultRawMemoryAllocator *this,size_t Size,size_t Alignment,Char *dbgDescription,
          char *dbgFileName,Int32 dbgLineNumber)

{
  void *pvVar1;
  ulong uVar2;
  string msg;
  ulong local_40;
  string local_38;
  
  if (Size == 0 || Alignment == 0) {
    FormatString<char[26],char[26]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Size > 0 && Alignment > 0",
               (char (*) [26])CONCAT71((int7)((ulong)dbgDescription >> 8),Alignment != 0));
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AllocateAligned",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DefaultRawMemoryAllocator.cpp"
               ,0x75);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = 8;
  if (8 < Alignment) {
    uVar2 = Alignment;
  }
  local_40 = uVar2;
  if ((uVar2 & uVar2 - 1) != 0) {
    FormatString<char[12],unsigned_long,char[23]>
              (&local_38,(Diligent *)"Alignment (",(char (*) [12])&local_40,
               (unsigned_long *)") must be a power of 2",(char (*) [23])dbgFileName);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  pvVar1 = (void *)aligned_alloc(uVar2,-local_40 & (Size + local_40) - 1);
  return pvVar1;
}

Assistant:

void* DefaultRawMemoryAllocator::AllocateAligned(size_t Size, size_t Alignment, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY_EXPR(Size > 0 && Alignment > 0);
    // Alignment must be a power of two and a multiple of sizeof(void*))
    Alignment = std::max(Alignment, sizeof(void*));
    // Size must be an integral multiple of alignment,
    // or aligned_alloc will return null
    Size = AlignUp(Size, Alignment);
    return ALIGNED_MALLOC(Size, Alignment, dbgFileName, dbgLineNumber);
}